

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fretInit.c
# Opt level: O3

void Abc_FlowRetime_UpdateBackwardInit(Abc_Ntk_t *pNtk)

{
  byte *pbVar1;
  Abc_Ntk_t *pNtk_00;
  Abc_Obj_t *pFrom;
  anon_union_8_4_f2c99bcb_for_Flow_Data_t__1 aVar2;
  uint *__ptr;
  void *pvVar3;
  uint *__ptr_00;
  Abc_Obj_t *pTo;
  void *pvVar4;
  Vec_Ptr_t *pVVar5;
  long lVar6;
  long lVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  ulong uVar13;
  ulong local_58;
  ulong local_50;
  
  __ptr = (uint *)malloc(0x10);
  __ptr[0] = 100;
  __ptr[1] = 0;
  pvVar3 = malloc(800);
  *(void **)(__ptr + 2) = pvVar3;
  __ptr_00 = (uint *)malloc(0x10);
  __ptr_00[0] = 100;
  __ptr_00[1] = 0;
  pvVar3 = malloc(800);
  *(void **)(__ptr_00 + 2) = pvVar3;
  pNtk_00 = pManMR->pInitNtk;
  pVVar5 = pNtk->vObjs;
  if (pVVar5->nSize < 1) {
    uVar9 = 0;
    uVar13 = 0;
  }
  else {
    uVar13 = 0;
    local_50 = 100;
    local_58 = 100;
    uVar9 = 0;
    lVar7 = 0;
    do {
      pvVar3 = pVVar5->pArray[lVar7];
      if ((pvVar3 != (void *)0x0) && ((*(uint *)((long)pvVar3 + 0x14) & 0xf) == 5)) {
        pFrom = pManMR->pDataArray[*(uint *)((long)pvVar3 + 0x10)].field_1.pred;
        if ((*(uint *)&pFrom->field_0x14 & 0xf) != 2) {
          __assert_fail("Abc_ObjIsPi(pInitObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fret/fretInit.c"
                        ,0x2a5,"void Abc_FlowRetime_UpdateBackwardInit(Abc_Ntk_t *)");
        }
        pTo = Abc_NtkCreateNodeBuf(pNtk_00,(Abc_Obj_t *)0x0);
        Abc_FlowRetime_ClearInitToOrig((Abc_Obj_t *)(ulong)(uint)pTo->Id);
        Abc_ObjBetterTransferFanout(pFrom,pTo,0);
        pManMR->pDataArray[*(uint *)((long)pvVar3 + 0x10)].field_1.pred = pTo;
        *(byte *)((long)pvVar3 + 0x14) = *(byte *)((long)pvVar3 + 0x14) | 0x10;
        uVar8 = (uint)local_58;
        if (uVar9 == uVar8) {
          if ((int)uVar8 < 0x10) {
            if (*(void **)(__ptr + 2) == (void *)0x0) {
              pvVar4 = malloc(0x80);
            }
            else {
              pvVar4 = realloc(*(void **)(__ptr + 2),0x80);
            }
            *(void **)(__ptr + 2) = pvVar4;
            *__ptr = 0x10;
            local_58 = 0x10;
          }
          else {
            local_58 = (ulong)(uVar8 * 2);
            if (*(void **)(__ptr + 2) == (void *)0x0) {
              pvVar4 = malloc(local_58 * 8);
            }
            else {
              pvVar4 = realloc(*(void **)(__ptr + 2),local_58 * 8);
            }
            *(void **)(__ptr + 2) = pvVar4;
            *__ptr = uVar8 * 2;
          }
        }
        else {
          pvVar4 = *(void **)(__ptr + 2);
        }
        iVar11 = (int)uVar13;
        __ptr[1] = uVar9 + 1;
        *(void **)((long)pvVar4 + (long)(int)uVar9 * 8) = pvVar3;
        iVar12 = (int)local_50;
        if (iVar11 == iVar12) {
          if (iVar12 < 0x10) {
            if (*(void **)(__ptr_00 + 2) == (void *)0x0) {
              pvVar3 = malloc(0x80);
            }
            else {
              pvVar3 = realloc(*(void **)(__ptr_00 + 2),0x80);
            }
            *(void **)(__ptr_00 + 2) = pvVar3;
            *__ptr_00 = 0x10;
            local_50 = 0x10;
          }
          else {
            local_50 = (ulong)(uint)(iVar12 * 2);
            if (*(void **)(__ptr_00 + 2) == (void *)0x0) {
              pvVar3 = malloc(local_50 * 8);
            }
            else {
              pvVar3 = realloc(*(void **)(__ptr_00 + 2),local_50 * 8);
            }
            *(void **)(__ptr_00 + 2) = pvVar3;
            *__ptr_00 = iVar12 * 2;
          }
        }
        else {
          pvVar3 = *(void **)(__ptr_00 + 2);
        }
        __ptr_00[1] = iVar11 + 1U;
        *(Abc_Obj_t **)((long)pvVar3 + (long)iVar11 * 8) = pFrom;
        pVVar5 = pNtk->vObjs;
        uVar13 = (ulong)(iVar11 + 1U);
        uVar9 = uVar9 + 1;
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < pVVar5->nSize);
  }
  pVVar5 = pNtk_00->vPis;
  lVar7 = (long)pVVar5->nSize;
  if (0 < lVar7) {
    lVar6 = 0;
    do {
      if (*(int *)((long)pVVar5->pArray[lVar6] + 0x2c) != 0) {
        __assert_fail("Abc_ObjFanoutNum( pInitObj ) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fret/fretInit.c"
                      ,0x2b8,"void Abc_FlowRetime_UpdateBackwardInit(Abc_Ntk_t *)");
      }
      lVar6 = lVar6 + 1;
    } while (lVar7 != lVar6);
  }
  pVVar5 = pNtk->vBoxes;
  if (0 < pVVar5->nSize) {
    lVar7 = 0;
    do {
      pvVar3 = pVVar5->pArray[lVar7];
      uVar8 = *(uint *)((long)pvVar3 + 0x14);
      if ((uVar8 & 0xf) == 8) {
        if ((int)uVar13 < 1) {
          __assert_fail("Vec_PtrSize(vPi) > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fret/fretInit.c"
                        ,0x2bd,"void Abc_FlowRetime_UpdateBackwardInit(Abc_Ntk_t *)");
        }
        uVar10 = (int)uVar13 - 1;
        uVar13 = (ulong)uVar10;
        __ptr_00[1] = uVar10;
        aVar2 = *(anon_union_8_4_f2c99bcb_for_Flow_Data_t__1 *)
                 (*(long *)(__ptr_00 + 2) + uVar13 * 8);
        *(uint *)((long)pvVar3 + 0x14) = uVar8 | 0x30;
        pManMR->pDataArray[*(uint *)((long)pvVar3 + 0x10)].field_1 = aVar2;
        *(anon_union_8_4_f2c99bcb_for_Flow_Data_t__1 *)((long)pvVar3 + 0x38) = aVar2;
        pVVar5 = pNtk->vBoxes;
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < pVVar5->nSize);
  }
  if (0 < (int)uVar9) {
    lVar7 = *(long *)(__ptr + 2);
    uVar13 = 0;
    do {
      Abc_FlowRetime_UpdateBackwardInit_rec(*(Abc_Obj_t **)(lVar7 + uVar13 * 8));
      uVar13 = uVar13 + 1;
    } while (uVar9 != uVar13);
  }
  pVVar5 = pNtk->vObjs;
  if (0 < pVVar5->nSize) {
    lVar7 = 0;
    do {
      if (pVVar5->pArray[lVar7] != (void *)0x0) {
        pbVar1 = (byte *)((long)pVVar5->pArray[lVar7] + 0x14);
        *pbVar1 = *pbVar1 & 0xcf;
        pVVar5 = pNtk->vObjs;
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < pVVar5->nSize);
  }
  if (*(void **)(__ptr + 2) != (void *)0x0) {
    free(*(void **)(__ptr + 2));
  }
  free(__ptr);
  if (*(void **)(__ptr_00 + 2) != (void *)0x0) {
    free(*(void **)(__ptr_00 + 2));
  }
  free(__ptr_00);
  return;
}

Assistant:

void Abc_FlowRetime_UpdateBackwardInit( Abc_Ntk_t * pNtk ) {
  Abc_Obj_t *pOrigObj,  *pInitObj;
  Vec_Ptr_t *vBo = Vec_PtrAlloc(100);
  Vec_Ptr_t *vPi = Vec_PtrAlloc(100);
  Abc_Ntk_t *pInitNtk = pManMR-> pInitNtk;
  Abc_Obj_t *pBuf;
  int i;

  // remove PIs from network (from BOs)
  Abc_NtkForEachObj( pNtk, pOrigObj, i )
    if (Abc_ObjIsBo(pOrigObj)) {
      pInitObj = FDATA(pOrigObj)->pInitObj;
      assert(Abc_ObjIsPi(pInitObj));

      // DEBUG
      // printf("update : freeing PI %d\n", pInitObj->Id);
      
      // create a buffer instead
      pBuf = Abc_NtkCreateNodeBuf( pInitNtk, NULL );
      Abc_FlowRetime_ClearInitToOrig( pBuf );

      Abc_ObjBetterTransferFanout( pInitObj, pBuf, 0 );
      FDATA(pOrigObj)->pInitObj = pBuf;
      pOrigObj->fMarkA = 1;

      Vec_PtrPush(vBo, pOrigObj);
      Vec_PtrPush(vPi, pInitObj);
    }
  
  // check that PIs are all free
  Abc_NtkForEachPi( pInitNtk, pInitObj, i) {
    assert( Abc_ObjFanoutNum( pInitObj ) == 0);
  }

  // add PIs to to latches
  Abc_NtkForEachLatch( pNtk, pOrigObj, i ) {
    assert(Vec_PtrSize(vPi) > 0);
    pInitObj = (Abc_Obj_t*)Vec_PtrPop(vPi);

    // DEBUG
    // printf("update : mapping latch %d to PI %d\n", pOrigObj->Id, pInitObj->Id);

    pOrigObj->fMarkA = pOrigObj->fMarkB = 1;
    FDATA(pOrigObj)->pInitObj = pInitObj;
    Abc_ObjSetData(pOrigObj, pInitObj);
  }  

  // recursively build init network
  Vec_PtrForEachEntry( Abc_Obj_t *, vBo, pOrigObj, i )
    Abc_FlowRetime_UpdateBackwardInit_rec( pOrigObj );
  
  // clear flags
  Abc_NtkForEachObj( pNtk, pOrigObj, i )
    pOrigObj->fMarkA = pOrigObj->fMarkB = 0;

  // deallocate
  Vec_PtrFree( vBo );
  Vec_PtrFree( vPi );
}